

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall kj::Vector<const_void_*>::setCapacity(Vector<const_void_*> *this,size_t newSize)

{
  void *__src;
  Entry *pEVar1;
  RemoveConst<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry> *pRVar2;
  Entry *pEVar3;
  ulong __n;
  ArrayBuilder<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry>
  local_38;
  
  if (newSize < (ulong)(*(long *)(this + 8) - *(long *)this >> 3)) {
    *(size_t *)(this + 8) = *(long *)this + newSize * 8;
  }
  local_38.pos = (RemoveConst<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry>
                  *)kj::_::HeapArrayDisposer::allocateImpl
                              (8,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = (Entry *)(&((local_38.pos)->key).parts.ptr + newSize);
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  __src = *(void **)this;
  local_38.ptr = local_38.pos;
  if (__src != *(void **)(this + 8)) {
    __n = (long)*(void **)(this + 8) - (long)__src & 0xfffffffffffffff8;
    memcpy(local_38.pos,__src,__n);
    local_38.pos = (RemoveConst<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry>
                    *)((long)&((local_38.pos)->key).parts.ptr + __n);
  }
  ArrayBuilder<const_void_*>::operator=((ArrayBuilder<const_void_*> *)this,&local_38);
  pEVar3 = local_38.endPtr;
  pRVar2 = local_38.pos;
  pEVar1 = local_38.ptr;
  if (local_38.ptr != (Entry *)0x0) {
    local_38.ptr = (Entry *)0x0;
    local_38.pos = (RemoveConst<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry>
                    *)0x0;
    local_38.endPtr = (Entry *)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,pEVar1,8,(long)pRVar2 - (long)pEVar1 >> 3,
               (long)pEVar3 - (long)pEVar1 >> 3,0);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }